

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O0

void __thiscall OPL::DOSBox::DBOPL::Operator::UpdateAttenuation(Operator *this)

{
  byte bVar1;
  Bit8u kslShift;
  Bit32u tl;
  Bit8u kslBase;
  Operator *this_local;
  
  bVar1 = *(byte *)((long)&KslShiftTable + (long)((int)(uint)this->reg40 >> 6));
  this->totalLevel = (this->reg40 & 0x3f) << 2;
  this->totalLevel = ((int)(this->chanData >> 0x10 & 0xff) >> (bVar1 & 0x1f)) + this->totalLevel;
  return;
}

Assistant:

inline void Operator::UpdateAttenuation( ) {
	Bit8u kslBase = (Bit8u)((chanData >> SHIFT_KSLBASE) & 0xff);
	Bit32u tl = reg40 & 0x3f;
	Bit8u kslShift = KslShiftTable[ reg40 >> 6 ];
	//Make sure the attenuation goes to the right bits
	totalLevel = tl << ( ENV_BITS - 7 );	//Total level goes 2 bits below max
	totalLevel += ( kslBase << ENV_EXTRA ) >> kslShift;
}